

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall XipFile::XipHeader::getdata(XipHeader *this,uint8_t *p)

{
  uint8_t *p_local;
  XipHeader *this_local;
  
  set32le<unsigned_char*>(p,this->dllfirst);
  set32le<unsigned_char*>(p + 4,this->dlllast);
  set32le<unsigned_char*>(p + 8,this->physfirst);
  set32le<unsigned_char*>(p + 0xc,this->physlast);
  set32le<unsigned_char*>(p + 0x10,this->nummods);
  set32le<unsigned_char*>(p + 0x14,this->ulRAMStart);
  set32le<unsigned_char*>(p + 0x18,this->ulRAMFree);
  set32le<unsigned_char*>(p + 0x1c,this->ulRAMEnd);
  set32le<unsigned_char*>(p + 0x20,this->ulCopyEntries);
  set32le<unsigned_char*>(p + 0x24,this->ulCopyOffset);
  set32le<unsigned_char*>(p + 0x28,this->ulProfileLen);
  set32le<unsigned_char*>(p + 0x2c,this->ulProfileOffset);
  set32le<unsigned_char*>(p + 0x30,this->numfiles);
  set32le<unsigned_char*>(p + 0x34,this->ulKernelFlags);
  set32le<unsigned_char*>(p + 0x38,this->ulFSRamPercent);
  set32le<unsigned_char*>(p + 0x3c,this->ulDrivglobStart);
  set32le<unsigned_char*>(p + 0x40,this->ulDrivglobLen);
  set16le<unsigned_char*>(p + 0x44,this->usCPUType);
  set16le<unsigned_char*>(p + 0x46,this->usMiscFlags);
  set32le<unsigned_char*>(p + 0x48,this->pExtensions);
  set32le<unsigned_char*>(p + 0x4c,this->ulTrackingStart);
  set32le<unsigned_char*>(p + 0x50,this->ulTrackingLen);
  return;
}

Assistant:

void getdata(uint8_t *p)
        {
            set32le(p+0x00, dllfirst);
            set32le(p+0x04, dlllast);
            set32le(p+0x08, physfirst);
            set32le(p+0x0c, physlast);
            set32le(p+0x10, nummods);
            set32le(p+0x14, ulRAMStart);
            set32le(p+0x18, ulRAMFree);
            set32le(p+0x1c, ulRAMEnd);
            set32le(p+0x20, ulCopyEntries);
            set32le(p+0x24, ulCopyOffset);
            set32le(p+0x28, ulProfileLen);
            set32le(p+0x2c, ulProfileOffset);
            set32le(p+0x30, numfiles);
            set32le(p+0x34, ulKernelFlags);
            set32le(p+0x38, ulFSRamPercent);
            set32le(p+0x3c, ulDrivglobStart);
            set32le(p+0x40, ulDrivglobLen);
            set16le(p+0x44, usCPUType);
            set16le(p+0x46, usMiscFlags);
            set32le(p+0x48, pExtensions);
            set32le(p+0x4c, ulTrackingStart);
            set32le(p+0x50, ulTrackingLen);
        }